

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_exception.cpp
# Opt level: O2

bool get_harmonic_mean_safe(double a,double b,double *c)

{
  double dVar1;
  
  dVar1 = -b;
  if ((dVar1 == a) && (!NAN(dVar1) && !NAN(a))) {
    return (bool)(-(a != dVar1) & 1);
  }
  *c = ((a + a) * b) / (b + a);
  std::operator<<((ostream *)&std::cout,"result = ");
}

Assistant:

bool get_harmonic_mean_safe(double a, double b, double * c) {
    if (a == -b) {
        return false;
    }

    //  pass function result via pointer param...
    *c = 2.0 * a * b / (a + b);
    std::cout << "result = " << *c << std::endl;
    return true;
}